

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

EnumValueSymbol * __thiscall
slang::BumpAllocator::emplace<slang::ast::EnumValueSymbol,char_const*&,slang::SourceLocation_const&>
          (BumpAllocator *this,char **args,SourceLocation *args_1)

{
  EnumValueSymbol *this_00;
  string_view local_30;
  SourceLocation *local_20;
  SourceLocation *args_local_1;
  char **args_local;
  BumpAllocator *this_local;
  
  local_20 = args_1;
  args_local_1 = (SourceLocation *)args;
  args_local = (char **)this;
  this_00 = (EnumValueSymbol *)allocate(this,0x98,8);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_30,(char *)*args_local_1);
  ast::EnumValueSymbol::EnumValueSymbol(this_00,local_30,*local_20);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }